

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  dxt1_solution_coordinates dVar1;
  ulong uVar2;
  int iVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint16 uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  unique_color *e1;
  uint uVar10;
  bool bVar11;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  dxt1_block::unpack_color((dxt1_block *)&c0,coords->m_low_color,true,0xff);
  dxt1_block::unpack_color((dxt1_block *)&c1,coords->m_high_color,true,0xff);
  iVar3 = (int)CONCAT71(in_register_00000011,alternate_rounding);
  sVar4 = (short)CONCAT71(in_register_00000011,alternate_rounding);
  c2.field_0.field_0.r =
       (uchar)(((uint)c1.field_0.field_0.r + iVar3 + (uint)c0.field_0.field_0.r * 2 & 0xffff) / 3);
  c2.field_0.field_0.g =
       (uchar)((ushort)((ushort)c1.field_0.field_0.g + sVar4 + (ushort)c0.field_0.field_0.g * 2) / 3
              );
  c2.field_0.field_0.b =
       (uchar)((ushort)((ushort)c1.field_0.field_0.b + sVar4 + (ushort)c0.field_0.field_0.b * 2) / 3
              );
  c2.field_0.field_0.a = '\0';
  c3.field_0.field_0.r =
       (uchar)(((uint)c0.field_0.field_0.r + iVar3 + (uint)c1.field_0.field_0.r * 2 & 0xffff) / 3);
  c3.field_0.field_0.g =
       (uchar)(((uint)c0.field_0.field_0.g + iVar3 + (uint)c1.field_0.field_0.g * 2 & 0xffff) / 3);
  c3.field_0.field_0.b =
       (uchar)((ushort)((ushort)c0.field_0.field_0.b + sVar4 + (ushort)c1.field_0.field_0.b * 2) / 3
              );
  c3.field_0.field_0.a = '\0';
  e1 = (this->m_evaluated_colors).m_p;
  uVar10 = (this->m_evaluated_colors).m_size;
  uVar9 = 0;
  while (uVar10 != 0) {
    uVar5 = crnlib::color::color_distance(true,&e1->m_color,&c0,false);
    uVar6 = crnlib::color::color_distance(true,&e1->m_color,&c1,false);
    if (uVar5 < uVar6) {
      uVar6 = uVar5;
    }
    uVar5 = crnlib::color::color_distance(true,&e1->m_color,&c2,false);
    uVar7 = crnlib::color::color_distance(true,&e1->m_color,&c3,false);
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    if (uVar6 < uVar7) {
      uVar7 = uVar6;
    }
    uVar9 = uVar9 + (ulong)e1->m_weight * (ulong)uVar7;
    e1 = e1 + 1;
    uVar10 = uVar10 - 1;
    if ((this->m_best_solution).m_error <= uVar9) {
      uVar10 = 0;
    }
  }
  uVar2 = (this->m_best_solution).m_error;
  if (uVar9 < uVar2) {
    dVar1 = *coords;
    (this->m_best_solution).m_coords = dVar1;
    (this->m_best_solution).m_error = uVar9;
    (this->m_best_solution).m_alpha_block = false;
    (this->m_best_solution).m_alternate_rounding = alternate_rounding;
    uVar8 = dVar1.m_low_color;
    bVar11 = uVar8 == dVar1.m_high_color;
    (this->m_best_solution).m_enforce_selector = bVar11;
    if (bVar11) {
      bVar11 = (~(uint)dVar1 & 0x1f) != 0;
      if (bVar11) {
        (this->m_best_solution).m_coords.m_low_color = uVar8 + 1;
      }
      else {
        (this->m_best_solution).m_coords.m_high_color = uVar8 - 1;
      }
      (this->m_best_solution).m_enforced_selector = bVar11;
    }
  }
  return uVar9 < uVar2;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
        uint64 error = 0;
        unique_color* color = m_evaluated_colors.get_ptr();
        for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0)
        {
            uint e01 = math::minimum(color::color_distance(true, color->m_color, c0, false), color::color_distance(true, color->m_color, c1, false));
            uint e23 = math::minimum(color::color_distance(true, color->m_color, c2, false), color::color_distance(true, color->m_color, c3, false));
            error += math::minimum(e01, e23) * (uint64)color->m_weight;
        }
        if (error >= m_best_solution.m_error)
        {
            return false;
        }
        m_best_solution.m_coords = coords;
        m_best_solution.m_error = error;
        m_best_solution.m_alpha_block = false;
        m_best_solution.m_alternate_rounding = alternate_rounding;
        m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
        if (m_best_solution.m_enforce_selector)
        {
            if ((m_best_solution.m_coords.m_low_color & 31) != 31)
            {
                m_best_solution.m_coords.m_low_color++;
                m_best_solution.m_enforced_selector = 1;
            }
            else
            {
                m_best_solution.m_coords.m_high_color--;
                m_best_solution.m_enforced_selector = 0;
            }
        }
        return true;
    }